

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall
fmt::v11::format_facet<std::locale>::format_facet(format_facet<std::locale> *this,locale *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  numpunct *pnVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  *(undefined4 *)&this->field_0x8 = 0;
  *(undefined ***)this = &PTR__format_facet_005397e0;
  (this->separator_)._M_dataplus._M_p = (pointer)&(this->separator_).field_2;
  (this->separator_)._M_string_length = 0;
  (this->separator_).field_2._M_local_buf[0] = '\0';
  (this->grouping_)._M_dataplus._M_p = (pointer)&(this->grouping_).field_2;
  (this->grouping_)._M_string_length = 0;
  (this->grouping_).field_2._M_local_buf[0] = '\0';
  (this->decimal_point_)._M_dataplus._M_p = (pointer)&(this->decimal_point_).field_2;
  (this->decimal_point_)._M_string_length = 0;
  (this->decimal_point_).field_2._M_local_buf[0] = '\0';
  pnVar2 = std::use_facet<std::__cxx11::numpunct<char>>(loc);
  (**(code **)(*(long *)pnVar2 + 0x20))(&local_50,pnVar2);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->grouping_,
             &local_50);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                             CONCAT11(local_50.field_2._M_local_buf[1],
                                      local_50.field_2._M_local_buf[0])) + 1);
  }
  if ((this->grouping_)._M_string_length != 0) {
    local_50.field_2._M_local_buf[0] = (**(code **)(*(long *)pnVar2 + 0x18))(pnVar2);
    local_50._M_string_length = 1;
    local_50.field_2._M_local_buf[1] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar1;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &this->separator_,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                               CONCAT11(local_50.field_2._M_local_buf[1],
                                        local_50.field_2._M_local_buf[0])) + 1);
    }
  }
  return;
}

Assistant:

format_facet<Locale>::format_facet(Locale& loc) {
  auto& np = detail::use_facet<detail::numpunct<char>>(loc);
  grouping_ = np.grouping();
  if (!grouping_.empty()) separator_ = std::string(1, np.thousands_sep());
}